

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_non_uniform.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_1::ValidateGroupNonUniformAllEqual
          (ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint32_t id;
  long lVar2;
  char *pcVar3;
  DiagnosticStream DStack_1f8;
  
  bVar1 = ValidationState_t::IsBoolScalarType(_,(inst->inst_).type_id);
  if (bVar1) {
    id = ValidationState_t::GetOperandTypeId(_,inst,3);
    bVar1 = ValidationState_t::IsFloatScalarOrVectorType(_,id);
    if (bVar1) {
      return SPV_SUCCESS;
    }
    bVar1 = ValidationState_t::IsIntScalarOrVectorType(_,id);
    if (bVar1) {
      return SPV_SUCCESS;
    }
    bVar1 = ValidationState_t::IsBoolScalarOrVectorType(_,id);
    if (bVar1) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar3 = "Value must be a scalar or vector of integer, floating-point, or boolean type";
    lVar2 = 0x4c;
  }
  else {
    ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar3 = "Result must be a boolean scalar type";
    lVar2 = 0x24;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&DStack_1f8,pcVar3,lVar2);
  DiagnosticStream::~DiagnosticStream(&DStack_1f8);
  return DStack_1f8.error_;
}

Assistant:

spv_result_t ValidateGroupNonUniformAllEqual(ValidationState_t& _,
                                             const Instruction* inst) {
  if (!_.IsBoolScalarType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Result must be a boolean scalar type";
  }

  const auto value_type = _.GetOperandTypeId(inst, 3);
  if (!_.IsFloatScalarOrVectorType(value_type) &&
      !_.IsIntScalarOrVectorType(value_type) &&
      !_.IsBoolScalarOrVectorType(value_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Value must be a scalar or vector of integer, floating-point, or "
              "boolean type";
  }

  return SPV_SUCCESS;
}